

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *
dg::getCalledFunctions
          (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
           *__return_storage_ptr__,Value *calledValue,LLVMPointerAnalysis *PTA)

{
  LLVMPointsToSetImpl *pLVar1;
  char cVar2;
  bool bVar3;
  Function *F;
  const_iterator __begin1;
  const_iterator __end1;
  value_type local_40;
  const_iterator local_38;
  LLVMPointsToSetImpl *local_30;
  const_iterator local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)PTA + 8))(&local_30,PTA,calledValue);
  pLVar1 = local_30;
  if (local_30 == (LLVMPointsToSetImpl *)0x0) {
    local_38.impl = (LLVMPointsToSetImpl *)0x0;
  }
  else {
    cVar2 = (**(code **)(*(long *)local_30 + 0x38))(local_30);
    local_38.impl = (LLVMPointsToSetImpl *)0x0;
    if (cVar2 == '\0') {
      local_38.impl = pLVar1;
    }
  }
  local_28.impl = (LLVMPointsToSetImpl *)0x0;
  while (bVar3 = LLVMPointsToSet::const_iterator::operator!=(&local_38,&local_28), bVar3) {
    local_40 = (value_type)(**(code **)(*(long *)local_38.impl + 0x48))();
    if (local_40[0x10] != (Function)0x0) {
      local_40 = (value_type)0x0;
    }
    if (local_40 != (value_type)0x0) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                (__return_storage_ptr__,&local_40);
    }
    LLVMPointsToSet::const_iterator::operator++(&local_38);
  }
  if (local_30 != (LLVMPointsToSetImpl *)0x0) {
    (**(code **)(*(long *)local_30 + 0x58))();
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<const llvm::Function *>
getCalledFunctions(const llvm::Value *calledValue, LLVMPointerAnalysis *PTA) {
    std::vector<const llvm::Function *> functions;
    for (const auto &llvmptr : PTA->getLLVMPointsTo(calledValue)) {
        if (auto *const F = llvm::dyn_cast<llvm::Function>(llvmptr.value)) {
            functions.push_back(F);
        }
    }
    return functions;
}